

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2icrs.cpp
# Opt level: O2

void PrintResults(CESkyCoord *input,CESkyCoord *output)

{
  double dVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  CEAngle local_b0;
  double local_a0;
  CEDate local_98;
  vector<double,_std::allocator<double>_> out_dms;
  vector<double,_std::allocator<double>_> out_hms;
  
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar3,JD);
  (*output->_vptr_CESkyCoord[3])(&out_dms,output,&local_98);
  CEAngle::HmsVect(&out_hms,(CEAngle *)&out_dms);
  CEAngle::~CEAngle((CEAngle *)&out_dms);
  CEDate::~CEDate(&local_98);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar3,JD);
  (*output->_vptr_CESkyCoord[4])(&local_b0,output,&local_98);
  CEAngle::DmsVect(&out_dms,&local_b0);
  CEAngle::~CEAngle(&local_b0);
  CEDate::~CEDate(&local_98);
  putchar(10);
  puts("******************************************");
  puts("* Results of Galactic -> ICRS conversion *");
  puts("******************************************");
  puts("ICRS Coordinates (output)");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&out_hms,0);
  dVar3 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&out_hms,1);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&out_hms,2);
  local_a0 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&out_hms,3);
  local_a0 = local_a0 + *pvVar2;
  dVar4 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar4,JD);
  (*output->_vptr_CESkyCoord[3])(&local_b0,output,&local_98);
  dVar4 = CEAngle::Deg(&local_b0);
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",local_a0,dVar4,
         (ulong)(uint)(int)dVar3,(ulong)(uint)(int)dVar1);
  CEAngle::~CEAngle(&local_b0);
  CEDate::~CEDate(&local_98);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar3,JD);
  (*input->_vptr_CESkyCoord[4])(&local_b0,input,&local_98);
  CEAngle::Deg(&local_b0);
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(&local_b0);
  CEDate::~CEDate(&local_98);
  puts("Galactic Coordinates (input)");
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar3,JD);
  (*input->_vptr_CESkyCoord[3])(&local_b0,input,&local_98);
  CEAngle::Deg(&local_b0);
  printf("    Galactic Lon.: %f degrees\n");
  CEAngle::~CEAngle(&local_b0);
  CEDate::~CEDate(&local_98);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar3,JD);
  (*input->_vptr_CESkyCoord[4])(&local_b0,input,&local_98);
  CEAngle::Deg(&local_b0);
  printf("    Galactic Lat.: %+f degrees\n");
  CEAngle::~CEAngle(&local_b0);
  CEDate::~CEDate(&local_98);
  putchar(10);
  std::vector<double,_std::allocator<double>_>::~vector(&out_dms);
  std::vector<double,_std::allocator<double>_>::~vector(&out_hms);
  return;
}

Assistant:

void PrintResults(const CESkyCoord& input,
                  const CESkyCoord& output)
{
    // Get the representation of the input icrs in hours, minutes, seconds
    std::vector<double> out_hms = output.XCoord().HmsVect();
    std::vector<double> out_dms = output.YCoord().DmsVect();
    
    std::printf("\n");
    std::printf("******************************************\n");
    std::printf("* Results of Galactic -> ICRS conversion *\n");
    std::printf("******************************************\n");
    std::printf("ICRS Coordinates (output)\n");
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(out_hms[0]), int(out_hms[1]), out_hms[2]+out_hms[3],
                output.XCoord().Deg());
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg());
    std::printf("Galactic Coordinates (input)\n");
    std::printf("    Galactic Lon.: %f degrees\n", input.XCoord().Deg());
    std::printf("    Galactic Lat.: %+f degrees\n", input.YCoord().Deg());
    std::printf("\n");
}